

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::checkCorrectnessBeforeParsing(CmdLine *this)

{
  anon_class_16_2_a4d9778a __f;
  anon_class_24_3_f4d57f4f __f_00;
  long in_RDI;
  StringList *pSVar1;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> cmds;
  StringList names;
  StringList flags;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_fffffffffffffed8;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *this_00;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  __last;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __last_00;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_fffffffffffffef0;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *this_01;
  undefined8 in_stack_ffffffffffffff00;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> local_50;
  undefined1 local_38 [24];
  ArgIface *local_20 [4];
  
  __last._M_current = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10e31e);
  __last_00._M_current =
       (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10e330);
  this_00 = &local_50;
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::vector
            ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x10e342);
  pSVar1 = (StringList *)(in_RDI + 0x38);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin(in_stack_fffffffffffffed8);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend(in_stack_fffffffffffffed8);
  __f_00.flags = (StringList *)in_RDI;
  __f_00.cmds = (vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                in_stack_ffffffffffffff00;
  __f_00.names = pSVar1;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::checkCorrectnessBeforeParsing()const::_lambda(auto:1_const&)_1_>
            (in_stack_fffffffffffffef0,__last_00,__f_00);
  this_01 = &local_50;
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cbegin(this_00);
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cend(this_00);
  __f.names = (StringList *)this_00;
  __f.flags = (StringList *)0x10e431;
  std::
  for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,Args::CmdLine::checkCorrectnessBeforeParsing()const::_lambda(Args::ArgIface*)_1_>
            ((__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
              )__last_00._M_current,__last,__f);
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~vector(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  return;
}

Assistant:

inline void
CmdLine::checkCorrectnessBeforeParsing() const
{
	StringList flags;
	StringList names;

	std::vector< ArgIface* > cmds;

	std::for_each( m_args.cbegin(), m_args.cend(),
		[ &cmds, &flags, &names ] ( const auto & arg )
		{
			if( arg->type() == ArgType::Command )
				cmds.push_back( arg.get() );
			else
				arg->checkCorrectnessBeforeParsing( flags, names );
		}
	);

	std::for_each( cmds.cbegin(), cmds.cend(),
		[ &flags, &names ] ( ArgIface * arg )
			{ arg->checkCorrectnessBeforeParsing( flags, names ); }
	);
}